

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::
     ReadRepeatedPrimitiveNoInline<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
               (int tag_size,uint32 tag,CodedInputStream *input,RepeatedField<int> *value)

{
  uint8 uVar1;
  byte bVar2;
  uint8 *puVar3;
  bool bVar4;
  int iVar5;
  byte *pbVar6;
  LogMessage *other;
  byte *pbVar7;
  int iVar8;
  LogLevel LVar9;
  uint32 temp;
  LogFinisher local_71;
  uint local_70;
  uint local_6c;
  LogMessage local_68;
  
  puVar3 = input->buffer_;
  if ((puVar3 < input->buffer_end_) && (uVar1 = *puVar3, -1 < (char)uVar1)) {
    input->buffer_ = puVar3 + 1;
    LVar9 = (int)(char)uVar1;
  }
  else {
    bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_68.level_);
    LVar9 = local_68.level_;
    if (!bVar4) {
      return false;
    }
  }
  iVar8 = value->current_size_;
  if (iVar8 == value->total_size_) {
    RepeatedField<int>::Reserve(value,iVar8 + 1);
    iVar8 = value->current_size_;
  }
  value->current_size_ = iVar8 + 1;
  value->elements_[iVar8] = LVar9;
  iVar8 = value->total_size_ - value->current_size_;
  if (iVar8 != 0 && value->current_size_ <= value->total_size_) {
    local_6c = tag & 0xff | 0x80;
    local_70 = tag >> 7;
    iVar8 = iVar8 + 1;
    do {
      if (tag < 0x80) {
        pbVar6 = input->buffer_;
        pbVar7 = input->buffer_end_;
        if (pbVar7 <= pbVar6) {
          return true;
        }
        if (*pbVar6 != tag) {
          return true;
        }
        pbVar6 = pbVar6 + 1;
      }
      else {
        if (0x3fff < tag) {
          return true;
        }
        pbVar6 = input->buffer_;
        pbVar7 = input->buffer_end_;
        if ((int)pbVar7 - (int)pbVar6 < 2) {
          return true;
        }
        if (local_6c != *pbVar6) {
          return true;
        }
        if (local_70 != pbVar6[1]) {
          return true;
        }
        pbVar6 = pbVar6 + 2;
      }
      input->buffer_ = pbVar6;
      if ((pbVar6 < pbVar7) && (bVar2 = *pbVar6, -1 < (char)bVar2)) {
        input->buffer_ = pbVar6 + 1;
        LVar9 = (int)(char)bVar2;
      }
      else {
        bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_68.level_);
        LVar9 = local_68.level_;
        if (!bVar4) {
          return false;
        }
      }
      iVar5 = value->current_size_;
      if (value->total_size_ <= iVar5) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x259);
        other = LogMessage::operator<<(&local_68,"CHECK failed: (size()) < (Capacity()): ");
        LogFinisher::operator=(&local_71,other);
        LogMessage::~LogMessage(&local_68);
        iVar5 = value->current_size_;
      }
      value->current_size_ = iVar5 + 1;
      value->elements_[iVar5] = LVar9;
      iVar8 = iVar8 + -1;
    } while (1 < iVar8);
  }
  return true;
}

Assistant:

bool WireFormatLite::ReadRepeatedPrimitiveNoInline(
    int tag_size,
    uint32 tag,
    io::CodedInputStream* input,
    RepeatedField<CType>* value) {
  return ReadRepeatedPrimitive<CType, DeclaredType>(
      tag_size, tag, input, value);
}